

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_number.cpp
# Opt level: O0

void DisableStartAndExpressionParsingStuff(ON_ParseSettings *parse_settings)

{
  ON_ParseSettings *parse_settings_local;
  
  ON_ParseSettings::SetParseLeadingWhiteSpace(parse_settings,false);
  ON_ParseSettings::SetParseUnaryMinus(parse_settings,false);
  ON_ParseSettings::SetParseUnaryPlus(parse_settings,false);
  ON_ParseSettings::SetAllExpressionSettingsToFalse(parse_settings);
  DisableCompoundUnitParsingStuff(parse_settings);
  return;
}

Assistant:

static void DisableStartAndExpressionParsingStuff(
  ON_ParseSettings& parse_settings
  )
{
  // parsing of things that have multiple numbers like
  // feet and inches, arc degrees minutes seconds,
  // integer-fraction and rational numbers uses
  // this helper to prevent "fancy" stuff when parsing
  // the "additional" numbers.
  parse_settings.SetParseLeadingWhiteSpace(false);
  parse_settings.SetParseUnaryMinus(false);
  parse_settings.SetParseUnaryPlus(false);
  parse_settings.SetAllExpressionSettingsToFalse();
  DisableCompoundUnitParsingStuff(parse_settings);
}